

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_toint(lua_State *L)

{
  undefined8 in_RAX;
  lua_Integer n;
  int valid;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  n = lua_tointegerx(L,1,&local_14);
  if (local_14 == 0) {
    math_toint();
  }
  else {
    lua_pushinteger(L,n);
  }
  return 1;
}

Assistant:

static int math_toint (lua_State *L) {
  int valid;
  lua_Integer n = lua_tointegerx(L, 1, &valid);
  if (l_likely(valid))
    lua_pushinteger(L, n);
  else {
    luaL_checkany(L, 1);
    luaL_pushfail(L);  /* value is not convertible to integer */
  }
  return 1;
}